

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

pair<unsigned_char,_unsigned_int> * createHuffCode(uchar *a,uint number)

{
  byte bVar1;
  pair<unsigned_char,_unsigned_int> *ppVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  
  ppVar2 = (pair<unsigned_char,_unsigned_int> *)malloc((ulong)(number * 8));
  iVar5 = 0;
  iVar4 = 0;
  for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
    bVar1 = a[lVar3];
    lVar6 = (long)iVar5;
    iVar5 = iVar5 + (uint)bVar1;
    for (lVar7 = 0; iVar5 - lVar6 != lVar7; lVar7 = lVar7 + 1) {
      ppVar2[lVar6 + lVar7].first = (char)lVar3 + '\x01';
      ppVar2[lVar6 + lVar7].second = iVar4 + (int)lVar7;
    }
    iVar4 = (uint)bVar1 * 2 + iVar4 * 2;
  }
  return ppVar2;
}

Assistant:

std::pair<unsigned char, unsigned int>* createHuffCode(unsigned char *a, unsigned int number) {
    int si = sizeof(std::pair<unsigned char, unsigned int>);
    auto ret = (std::pair<unsigned char, unsigned int>*)malloc(si * number);
    int code = 0;
    int count = 0;
    for (int i = 0; i < 16; i++) {
        for (int j = 0; j < a[i]; j++) {
            ret[count++] = std::make_pair(i + 1, code);
            code += 1;
        }
        code = code << 1;
    }
    return ret;
}